

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_tag_handle
              (yaml_parser_t *parser,int directive,yaml_mark_t start_mark,yaml_char_t **handle)

{
  yaml_char_t *pyVar1;
  int iVar2;
  yaml_char_t *pyVar3;
  char *context;
  bool bVar4;
  yaml_char_t *local_40;
  yaml_string_t string;
  yaml_char_t **handle_local;
  int directive_local;
  yaml_parser_t *parser_local;
  
  string.pointer = (yaml_char_t *)handle;
  memset(&local_40,0,0x18);
  local_40 = (yaml_char_t *)yaml_malloc(0x10);
  if (local_40 == (yaml_char_t *)0x0) {
    parser->error = YAML_MEMORY_ERROR;
  }
  else {
    string.start = local_40 + 0x10;
    string.end = local_40;
    memset(local_40,0,0x10);
    if ((parser->unread != 0) || (iVar2 = yaml_parser_update_buffer(parser,1), iVar2 != 0)) {
      if (*(parser->buffer).pointer == '!') {
        if ((string.end + 5 < string.start) ||
           (iVar2 = yaml_string_extend(&local_40,&string.end,&string.start), iVar2 != 0)) {
          if ((*(parser->buffer).pointer & 0x80) == 0) {
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            *string.end = *pyVar1;
            string.end = string.end + 1;
          }
          else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            pyVar3 = string.end + 1;
            *string.end = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            string.end = string.end + 2;
            *pyVar3 = *pyVar1;
          }
          else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            *string.end = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            pyVar3 = string.end + 2;
            string.end[1] = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            string.end = string.end + 3;
            *pyVar3 = *pyVar1;
          }
          else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            *string.end = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            string.end[1] = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            pyVar3 = string.end + 3;
            string.end[2] = *pyVar1;
            pyVar1 = (parser->buffer).pointer;
            (parser->buffer).pointer = pyVar1 + 1;
            string.end = string.end + 4;
            *pyVar3 = *pyVar1;
          }
          (parser->mark).index = (parser->mark).index + 1;
          (parser->mark).column = (parser->mark).column + 1;
          parser->unread = parser->unread - 1;
          if (parser->unread != 0) goto LAB_0023c593;
          iVar2 = yaml_parser_update_buffer(parser,1);
          while (iVar2 != 0) {
LAB_0023c593:
            do {
              if ((((*(parser->buffer).pointer < 0x30) ||
                   (bVar4 = true, 0x39 < *(parser->buffer).pointer)) &&
                  ((*(parser->buffer).pointer < 0x41 ||
                   (bVar4 = true, 0x5a < *(parser->buffer).pointer)))) &&
                 (((*(parser->buffer).pointer < 0x61 ||
                   (bVar4 = true, 0x7a < *(parser->buffer).pointer)) &&
                  (bVar4 = true, *(parser->buffer).pointer != '_')))) {
                bVar4 = *(parser->buffer).pointer == '-';
              }
              if (!bVar4) {
                if (*(parser->buffer).pointer == '!') {
                  if ((string.start <= string.end + 5) &&
                     (iVar2 = yaml_string_extend(&local_40,&string.end,&string.start), iVar2 == 0))
                  {
                    parser->error = YAML_MEMORY_ERROR;
                    goto LAB_0023cd11;
                  }
                  if ((*(parser->buffer).pointer & 0x80) == 0) {
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    *string.end = *pyVar1;
                  }
                  else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    *string.end = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[1] = *pyVar1;
                  }
                  else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    *string.end = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[1] = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[2] = *pyVar1;
                  }
                  else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    *string.end = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[1] = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[2] = *pyVar1;
                    pyVar1 = (parser->buffer).pointer;
                    (parser->buffer).pointer = pyVar1 + 1;
                    string.end[3] = *pyVar1;
                  }
                  (parser->mark).index = (parser->mark).index + 1;
                  (parser->mark).column = (parser->mark).column + 1;
                  parser->unread = parser->unread - 1;
                }
                else if ((directive != 0) && ((*local_40 != '!' || (local_40[1] != '\0')))) {
                  yaml_parser_set_scanner_error
                            (parser,"while parsing a tag directive",start_mark,
                             "did not find expected \'!\'");
                  goto LAB_0023cd11;
                }
                *(yaml_char_t **)string.pointer = local_40;
                return 1;
              }
              if ((string.start <= string.end + 5) &&
                 (iVar2 = yaml_string_extend(&local_40,&string.end,&string.start), iVar2 == 0)) {
                parser->error = YAML_MEMORY_ERROR;
                goto LAB_0023cd11;
              }
              if ((*(parser->buffer).pointer & 0x80) == 0) {
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                *string.end = *pyVar1;
                string.end = string.end + 1;
              }
              else if ((*(parser->buffer).pointer & 0xe0) == 0xc0) {
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                pyVar3 = string.end + 1;
                *string.end = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                string.end = string.end + 2;
                *pyVar3 = *pyVar1;
              }
              else if ((*(parser->buffer).pointer & 0xf0) == 0xe0) {
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                *string.end = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                pyVar3 = string.end + 2;
                string.end[1] = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                string.end = string.end + 3;
                *pyVar3 = *pyVar1;
              }
              else if ((*(parser->buffer).pointer & 0xf8) == 0xf0) {
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                *string.end = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                string.end[1] = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                pyVar3 = string.end + 3;
                string.end[2] = *pyVar1;
                pyVar1 = (parser->buffer).pointer;
                (parser->buffer).pointer = pyVar1 + 1;
                string.end = string.end + 4;
                *pyVar3 = *pyVar1;
              }
              (parser->mark).index = (parser->mark).index + 1;
              (parser->mark).column = (parser->mark).column + 1;
              parser->unread = parser->unread - 1;
            } while (parser->unread != 0);
            iVar2 = yaml_parser_update_buffer(parser,1);
          }
        }
        else {
          parser->error = YAML_MEMORY_ERROR;
        }
      }
      else {
        context = "while scanning a tag";
        if (directive != 0) {
          context = "while scanning a tag directive";
        }
        yaml_parser_set_scanner_error(parser,context,start_mark,"did not find expected \'!\'");
      }
    }
  }
LAB_0023cd11:
  yaml_free(local_40);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_handle(yaml_parser_t *parser, int directive,
        yaml_mark_t start_mark, yaml_char_t **handle)
{
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Check the initial '!' character. */

    if (!CACHE(parser, 1)) goto error;

    if (!CHECK(parser->buffer, '!')) {
        yaml_parser_set_scanner_error(parser, directive ?
                "while scanning a tag directive" : "while scanning a tag",
                start_mark, "did not find expected '!'");
        goto error;
    }

    /* Copy the '!' character. */

    if (!READ(parser, string)) goto error;

    /* Copy all subsequent alphabetical and numerical characters. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_ALPHA(parser->buffer))
    {
        if (!READ(parser, string)) goto error;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the trailing character is '!' and copy it. */

    if (CHECK(parser->buffer, '!'))
    {
        if (!READ(parser, string)) goto error;
    }
    else
    {
        /*
         * It's either the '!' tag or not really a tag handle.  If it's a %TAG
         * directive, it's an error.  If it's a tag token, it must be a part of
         * URI.
         */

        if (directive && !(string.start[0] == '!' && string.start[1] == '\0')) {
            yaml_parser_set_scanner_error(parser, "while parsing a tag directive",
                    start_mark, "did not find expected '!'");
            goto error;
        }
    }

    *handle = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}